

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O0

void __thiscall
Lib::DArray<Kernel::Term*>::initFromIterator<Lib::VirtualIterator<Kernel::Term*>>
          (DArray<Kernel::Term_*> *this,VirtualIterator<Kernel::Term_*> *it,size_t count)

{
  bool bVar1;
  Term *pTVar2;
  Term **ppTVar3;
  long in_RDX;
  size_t in_RSI;
  DArray<Kernel::Term_*> *in_RDI;
  Term **ptr;
  Term **local_20;
  size_t local_18;
  
  if (in_RDX == 0) {
    DArray<Kernel::Term_*>::ensure(in_RDI,in_RSI);
    local_18 = 0;
    while (bVar1 = VirtualIterator<Kernel::Term_*>::hasNext
                             ((VirtualIterator<Kernel::Term_*> *)0x7fe00d), bVar1) {
      DArray<Kernel::Term_*>::expand(this,(size_t)it);
      pTVar2 = VirtualIterator<Kernel::Term_*>::next((VirtualIterator<Kernel::Term_*> *)0x7fe035);
      ppTVar3 = DArray<Kernel::Term_*>::operator[](in_RDI,local_18);
      *ppTVar3 = pTVar2;
      local_18 = local_18 + 1;
    }
  }
  else {
    DArray<Kernel::Term_*>::ensure(in_RDI,in_RSI);
    local_20 = in_RDI->_array;
    while (bVar1 = VirtualIterator<Kernel::Term_*>::hasNext
                             ((VirtualIterator<Kernel::Term_*> *)0x7fdfc1), bVar1) {
      pTVar2 = VirtualIterator<Kernel::Term_*>::next((VirtualIterator<Kernel::Term_*> *)0x7fdfd1);
      *local_20 = pTVar2;
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

void initFromIterator(It it, size_t count=0) {
    if(count) {
      ensure(count);
      C* ptr=_array;
      while(it.hasNext()) {
	*(ptr++)=it.next();
      }
    } else {
      ensure(0);
      count=0;
      while(it.hasNext()) {
	expand(++count);
	(*this)[count-1]=it.next();
      }
    }
  }